

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O2

void __thiscall QAction::setWhatsThis(QAction *this,QString *whatsthis)

{
  QString *s1;
  QActionPrivate *this_00;
  bool bVar1;
  
  this_00 = *(QActionPrivate **)&this->field_0x8;
  s1 = &this_00->whatsthis;
  bVar1 = ::comparesEqual(s1,whatsthis);
  if (bVar1) {
    return;
  }
  QString::operator=(s1,(QString *)whatsthis);
  QActionPrivate::sendDataChanged(this_00);
  return;
}

Assistant:

void QAction::setWhatsThis(const QString &whatsthis)
{
    Q_D(QAction);
    if (d->whatsthis == whatsthis)
        return;

    d->whatsthis = whatsthis;
    d->sendDataChanged();
}